

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Hadamard<std::complex<double>_>::Hadamard(Hadamard<std::complex<double>_> *this)

{
  Hadamard<std::complex<double>_> *this_local;
  
  QGate1<std::complex<double>_>::QGate1(&this->super_QGate1<std::complex<double>_>);
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00158c08;
  return;
}

Assistant:

QGate1()
        : qubit_( 0 )
        { }